

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

void unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,
                    unsigned_short *toLim)

{
  unsigned_short *puVar1;
  unsigned_short **ppuVar2;
  short sVar3;
  byte *pbVar5;
  int iVar4;
  
  pbVar5 = (byte *)*fromP;
  puVar1 = (unsigned_short *)fromLim;
  ppuVar2 = toP;
  while ((pbVar5 != (byte *)fromLim && (*toP != toLim))) {
    sVar3 = *(short *)((long)enc[3].literalScanners + (ulong)*pbVar5 * 2 + 0x18);
    if (sVar3 == 0) {
      iVar4 = (*enc[3].literalScanners[1])
                        ((ENCODING *)enc[3].sameName,(char *)pbVar5,(char *)puVar1,(char **)ppuVar2)
      ;
      sVar3 = (short)iVar4;
      pbVar5 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3
                                 ));
    }
    else {
      pbVar5 = pbVar5 + 1;
    }
    *fromP = (char *)pbVar5;
    ppuVar2 = (unsigned_short **)*toP;
    puVar1 = (unsigned_short *)((long)ppuVar2 + 2);
    *toP = puVar1;
    *(short *)ppuVar2 = sVar3;
    pbVar5 = (byte *)*fromP;
  }
  return;
}

Assistant:

static
void unknown_toUtf16(const ENCODING *enc,
                     const char **fromP, const char *fromLim,
                     unsigned short **toP, const unsigned short *toLim)
{
  while (*fromP != fromLim && *toP != toLim) {
    unsigned short c
      = ((const struct unknown_encoding *)enc)->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)((const struct unknown_encoding *)enc)
           ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }
}